

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void Cmd_dumpstates(FCommandLine *argv,APlayerPawn *who,int key)

{
  FStateLabels *StateList;
  uint uVar1;
  uint uVar2;
  PClassActor **ppPVar3;
  char *pcVar4;
  FString local_30;
  PClassActor *local_28;
  PClassActor *info;
  uint i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  info._0_4_ = 0;
  info._4_4_ = key;
  _i = who;
  who_local = (APlayerPawn *)argv;
  while( true ) {
    uVar1 = (uint)info;
    uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
    if (uVar2 <= uVar1) break;
    ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)(uint)info);
    local_28 = *ppPVar3;
    pcVar4 = FName::GetChars(&(local_28->super_PClass).super_PNativeStruct.super_PStruct.
                              super_PNamedType.TypeName);
    Printf(5,"State labels for %s\n",pcVar4);
    StateList = local_28->StateList;
    FString::FString(&local_30,"");
    DumpStateHelper(StateList,&local_30);
    FString::~FString(&local_30);
    Printf(5,"----------------------------\n");
    info._0_4_ = (uint)info + 1;
  }
  return;
}

Assistant:

CCMD(dumpstates)
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		PClassActor *info = PClassActor::AllActorClasses[i];
		Printf(PRINT_LOG, "State labels for %s\n", info->TypeName.GetChars());
		DumpStateHelper(info->StateList, "");
		Printf(PRINT_LOG, "----------------------------\n");
	}
}